

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_fetch.hpp
# Opt level: O1

void duckdb::PatasFetchRow<double>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  PatasScanState<double> local_2c88;
  
  PatasScanState<double>::PatasScanState(&local_2c88,segment);
  PatasScanState<double>::Skip(&local_2c88,segment,row_id);
  pdVar2 = result->data;
  pdVar1 = pdVar2 + result_idx * 8;
  pdVar1[0] = '\0';
  pdVar1[1] = '\0';
  pdVar1[2] = '\0';
  pdVar1[3] = '\0';
  pdVar1[4] = '\0';
  pdVar1[5] = '\0';
  pdVar1[6] = '\0';
  pdVar1[7] = '\0';
  if (((local_2c88.total_value_count & 0x3ff) == 0) &&
     (local_2c88.total_value_count < local_2c88.count)) {
    PatasScanState<double>::LoadGroup<false>(&local_2c88,local_2c88.group_state.values);
  }
  *(unsigned_long *)(pdVar2 + result_idx * 8) =
       local_2c88.group_state.values[local_2c88.group_state.index];
  local_2c88.total_value_count = local_2c88.total_value_count + 1;
  local_2c88.group_state.index = local_2c88.group_state.index + 1;
  local_2c88.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__PatasScanState_024878f8;
  BufferHandle::~BufferHandle(&local_2c88.handle);
  return;
}

Assistant:

void PatasFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;

	PatasScanState<T> scan_state(segment);
	scan_state.Skip(segment, UnsafeNumericCast<idx_t>(row_id));
	auto result_data = FlatVector::GetData<EXACT_TYPE>(result);
	result_data[result_idx] = (EXACT_TYPE)0;

	if (scan_state.GroupFinished() && scan_state.total_value_count < scan_state.count) {
		scan_state.LoadGroup(scan_state.group_state.values);
	}
	scan_state.group_state.Scan((uint8_t *)(result_data + result_idx), 1);
	scan_state.total_value_count++;
}